

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<double,_1,_0>::calcCrossProductsStates
          (BeagleCPU4StateImpl<double,_1,_0> *this,int *tipStates,double *preOrderPartial,
          double *categoryRates,double *categoryWeights,double edgeLength,double *outCrossProducts,
          double *outSumSquaredDerivatives)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  value_type vVar6;
  double dVar7;
  int iVar8;
  int iVar9;
  reference pvVar10;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  double in_XMM0_Qa;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  int k_3;
  int k_2;
  double patternWeight_1;
  int j;
  int k_1;
  int k;
  double denominator_1;
  int v_1;
  int patternIndex_1;
  double weight_1;
  double scale_1;
  int category_1;
  double patternWeight;
  double ppre3;
  double ppre2;
  double ppre1;
  double ppre0;
  double denominator;
  int v;
  int patternIndex;
  double weight;
  double scale;
  int category;
  int state;
  double patternDenominator;
  int pattern;
  array<double,_16UL> withinPattern;
  array<double,_16UL> acrossPatterns;
  double in_stack_fffffffffffffd68;
  array<double,_16UL> *in_stack_fffffffffffffd70;
  value_type *in_stack_fffffffffffffd78;
  array<double,_16UL> *in_stack_fffffffffffffd80;
  undefined4 local_1f0;
  undefined4 local_1ec;
  undefined4 local_1dc;
  undefined4 local_1d8;
  undefined4 local_1d4;
  undefined8 local_1d0;
  undefined4 local_1ac;
  undefined4 local_160;
  undefined8 local_158;
  undefined4 local_144;
  
  std::array<double,_16UL>::fill(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  for (local_144 = 0; local_144 < *(int *)(in_RDI + 0x14); local_144 = local_144 + 1) {
    std::array<double,_16UL>::fill(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    local_158 = 0.0;
    iVar9 = *(int *)(in_RSI + (long)local_144 * 4);
    if (iVar9 < *(int *)(in_RDI + 0x24)) {
      for (local_160 = 0; local_160 < *(int *)(in_RDI + 0x34); local_160 = local_160 + 1) {
        dVar7 = *(double *)(in_RCX + (long)local_160 * 8) * in_XMM0_Qa;
        dVar1 = *(double *)(in_R8 + (long)local_160 * 8);
        iVar8 = (local_160 * *(int *)(in_RDI + 0x14) + local_144) * 4;
        auVar23._8_8_ = 0;
        auVar23._0_8_ = *(ulong *)(in_RDX + (long)(iVar8 + iVar9) * 8);
        auVar11._8_8_ = 0;
        auVar11._0_8_ = dVar1;
        auVar35._8_8_ = 0;
        auVar35._0_8_ = local_158;
        auVar20 = vfmadd213sd_fma(auVar11,auVar23,auVar35);
        local_158 = auVar20._0_8_;
        dVar2 = *(double *)(in_RDX + (long)iVar8 * 8);
        dVar3 = *(double *)(in_RDX + (long)(iVar8 + 1) * 8);
        dVar4 = *(double *)(in_RDX + (long)(iVar8 + 2) * 8);
        dVar5 = *(double *)(in_RDX + (long)(iVar8 + 3) * 8);
        pvVar10 = std::array<double,_16UL>::operator[]
                            (in_stack_fffffffffffffd70,(size_type)in_stack_fffffffffffffd68);
        auVar12._8_8_ = 0;
        auVar12._0_8_ = dVar7;
        auVar24._8_8_ = 0;
        auVar24._0_8_ = dVar2 * dVar1;
        auVar36._8_8_ = 0;
        auVar36._0_8_ = *pvVar10;
        auVar20 = vfmadd213sd_fma(auVar12,auVar24,auVar36);
        *pvVar10 = auVar20._0_8_;
        pvVar10 = std::array<double,_16UL>::operator[]
                            (in_stack_fffffffffffffd70,(size_type)in_stack_fffffffffffffd68);
        auVar13._8_8_ = 0;
        auVar13._0_8_ = dVar7;
        auVar25._8_8_ = 0;
        auVar25._0_8_ = dVar3 * dVar1;
        auVar37._8_8_ = 0;
        auVar37._0_8_ = *pvVar10;
        auVar20 = vfmadd213sd_fma(auVar13,auVar25,auVar37);
        *pvVar10 = auVar20._0_8_;
        pvVar10 = std::array<double,_16UL>::operator[]
                            (in_stack_fffffffffffffd70,(size_type)in_stack_fffffffffffffd68);
        auVar14._8_8_ = 0;
        auVar14._0_8_ = dVar7;
        auVar26._8_8_ = 0;
        auVar26._0_8_ = dVar4 * dVar1;
        auVar38._8_8_ = 0;
        auVar38._0_8_ = *pvVar10;
        auVar20 = vfmadd213sd_fma(auVar14,auVar26,auVar38);
        *pvVar10 = auVar20._0_8_;
        pvVar10 = std::array<double,_16UL>::operator[]
                            (in_stack_fffffffffffffd70,(size_type)in_stack_fffffffffffffd68);
        auVar15._8_8_ = 0;
        auVar15._0_8_ = dVar7;
        auVar27._8_8_ = 0;
        auVar27._0_8_ = dVar5 * dVar1;
        auVar39._8_8_ = 0;
        auVar39._0_8_ = *pvVar10;
        auVar20 = vfmadd213sd_fma(auVar15,auVar27,auVar39);
        *pvVar10 = auVar20._0_8_;
      }
      auVar16._0_8_ = *(double *)(*(long *)(in_RDI + 0x80) + (long)local_144 * 8) / local_158;
      pvVar10 = std::array<double,_16UL>::operator[]
                          (in_stack_fffffffffffffd70,(size_type)in_stack_fffffffffffffd68);
      vVar6 = *pvVar10;
      pvVar10 = std::array<double,_16UL>::operator[]
                          (in_stack_fffffffffffffd70,(size_type)in_stack_fffffffffffffd68);
      auVar16._8_8_ = 0;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = vVar6;
      auVar40._8_8_ = 0;
      auVar40._0_8_ = *pvVar10;
      auVar20 = vfmadd213sd_fma(auVar16,auVar28,auVar40);
      *pvVar10 = auVar20._0_8_;
      pvVar10 = std::array<double,_16UL>::operator[]
                          (in_stack_fffffffffffffd70,(size_type)in_stack_fffffffffffffd68);
      vVar6 = *pvVar10;
      pvVar10 = std::array<double,_16UL>::operator[]
                          (in_stack_fffffffffffffd70,(size_type)in_stack_fffffffffffffd68);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = auVar16._0_8_;
      auVar29._8_8_ = 0;
      auVar29._0_8_ = vVar6;
      auVar41._8_8_ = 0;
      auVar41._0_8_ = *pvVar10;
      auVar20 = vfmadd213sd_fma(auVar17,auVar29,auVar41);
      *pvVar10 = auVar20._0_8_;
      pvVar10 = std::array<double,_16UL>::operator[]
                          (in_stack_fffffffffffffd70,(size_type)in_stack_fffffffffffffd68);
      vVar6 = *pvVar10;
      pvVar10 = std::array<double,_16UL>::operator[]
                          (in_stack_fffffffffffffd70,(size_type)in_stack_fffffffffffffd68);
      auVar18._8_8_ = 0;
      auVar18._0_8_ = auVar16._0_8_;
      auVar30._8_8_ = 0;
      auVar30._0_8_ = vVar6;
      auVar42._8_8_ = 0;
      auVar42._0_8_ = *pvVar10;
      auVar20 = vfmadd213sd_fma(auVar18,auVar30,auVar42);
      *pvVar10 = auVar20._0_8_;
      pvVar10 = std::array<double,_16UL>::operator[]
                          (in_stack_fffffffffffffd70,(size_type)in_stack_fffffffffffffd68);
      vVar6 = *pvVar10;
      pvVar10 = std::array<double,_16UL>::operator[]
                          (in_stack_fffffffffffffd70,(size_type)in_stack_fffffffffffffd68);
      auVar19._8_8_ = 0;
      auVar19._0_8_ = auVar16._0_8_;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = vVar6;
      auVar43._8_8_ = 0;
      auVar43._0_8_ = *pvVar10;
      auVar20 = vfmadd213sd_fma(auVar19,auVar31,auVar43);
      *pvVar10 = auVar20._0_8_;
    }
    else {
      for (local_1ac = 0; local_1ac < *(int *)(in_RDI + 0x34); local_1ac = local_1ac + 1) {
        dVar1 = *(double *)(in_RCX + (long)local_1ac * 8);
        dVar2 = *(double *)(in_R8 + (long)local_1ac * 8);
        iVar9 = (local_1ac * *(int *)(in_RDI + 0x14) + local_144) * 4;
        local_1d0 = 0.0;
        for (local_1d4 = 0; local_1d4 < 4; local_1d4 = local_1d4 + 1) {
          local_1d0 = *(double *)(in_RDX + (long)(iVar9 + local_1d4) * 8) + local_1d0;
        }
        auVar32._8_8_ = 0;
        auVar32._0_8_ = local_1d0;
        auVar20._8_8_ = 0;
        auVar20._0_8_ = dVar2;
        auVar44._8_8_ = 0;
        auVar44._0_8_ = local_158;
        auVar20 = vfmadd213sd_fma(auVar20,auVar32,auVar44);
        local_158 = auVar20._0_8_;
        for (local_1d8 = 0; local_1d8 < 4; local_1d8 = local_1d8 + 1) {
          for (local_1dc = 0; local_1dc < 4; local_1dc = local_1dc + 1) {
            in_stack_fffffffffffffd80 =
                 (array<double,_16UL> *)
                 (*(double *)(in_RDX + (long)(iVar9 + local_1d8) * 8) * dVar2);
            in_stack_fffffffffffffd78 = (value_type *)(dVar1 * in_XMM0_Qa);
            pvVar10 = std::array<double,_16UL>::operator[]
                                (in_stack_fffffffffffffd70,(size_type)in_stack_fffffffffffffd68);
            auVar21._8_8_ = 0;
            auVar21._0_8_ = in_stack_fffffffffffffd78;
            auVar33._8_8_ = 0;
            auVar33._0_8_ = in_stack_fffffffffffffd80;
            auVar45._8_8_ = 0;
            auVar45._0_8_ = *pvVar10;
            auVar20 = vfmadd213sd_fma(auVar21,auVar33,auVar45);
            *pvVar10 = auVar20._0_8_;
          }
        }
      }
      local_158 = *(double *)(*(long *)(in_RDI + 0x80) + (long)local_144 * 8) / local_158;
      for (local_1ec = 0; local_1ec < 0x10; local_1ec = local_1ec + 1) {
        pvVar10 = std::array<double,_16UL>::operator[]
                            (in_stack_fffffffffffffd70,(size_type)in_stack_fffffffffffffd68);
        in_stack_fffffffffffffd70 = (array<double,_16UL> *)*pvVar10;
        in_stack_fffffffffffffd68 = local_158;
        pvVar10 = std::array<double,_16UL>::operator[]
                            (in_stack_fffffffffffffd70,(size_type)local_158);
        auVar22._8_8_ = 0;
        auVar22._0_8_ = in_stack_fffffffffffffd68;
        auVar34._8_8_ = 0;
        auVar34._0_8_ = in_stack_fffffffffffffd70;
        auVar46._8_8_ = 0;
        auVar46._0_8_ = *pvVar10;
        auVar20 = vfmadd213sd_fma(auVar22,auVar34,auVar46);
        *pvVar10 = auVar20._0_8_;
      }
    }
  }
  for (local_1f0 = 0; local_1f0 < 0x10; local_1f0 = local_1f0 + 1) {
    pvVar10 = std::array<double,_16UL>::operator[]
                        (in_stack_fffffffffffffd70,(size_type)in_stack_fffffffffffffd68);
    *(double *)(in_R9 + (long)local_1f0 * 8) = *pvVar10 + *(double *)(in_R9 + (long)local_1f0 * 8);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcCrossProductsStates(const int *tipStates,
                                                                const REALTYPE *preOrderPartial,
                                                                const double *categoryRates,
                                                                const REALTYPE *categoryWeights,
                                                                const double edgeLength,
                                                                double *outCrossProducts,
                                                                double *outSumSquaredDerivatives) {
#ifdef OLD_CP_STATES
    return BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcCrossProductsStates(tipStates, preOrderPartial, categoryRates,
            categoryWeights, edgeLength, outCrossProducts, outSumSquaredDerivatives);
#else
    std::array<REALTYPE, 16> acrossPatterns;
    acrossPatterns.fill((REALTYPE) 0);

    std::array<REALTYPE, 16> withinPattern;

    for (int pattern = 0; pattern < kPatternCount; pattern++) {

        withinPattern.fill((REALTYPE) 0);
        REALTYPE patternDenominator = 0.0;

        const int state = tipStates[pattern];

        if (state < kStateCount) {

            for (int category = 0; category < kCategoryCount; category++) {

                const REALTYPE scale = (REALTYPE) categoryRates[category] * edgeLength;

                const REALTYPE weight = categoryWeights[category];
                const int patternIndex = category * kPatternCount + pattern;
                const int v = patternIndex * 4;

                REALTYPE denominator = preOrderPartial[v + state];
                patternDenominator += denominator * weight;

                PREFETCH_PARTIALS(pre, preOrderPartial, v);

                withinPattern[0 * 4 + state] += ppre0 * weight * scale; // TODO Work with transpose(withinPattern)
                withinPattern[1 * 4 + state] += ppre1 * weight * scale;
                withinPattern[2 * 4 + state] += ppre2 * weight * scale;
                withinPattern[3 * 4 + state] += ppre3 * weight * scale;
            }

            const REALTYPE patternWeight = gPatternWeights[pattern] / patternDenominator;
            acrossPatterns[0 * 4 + state] += withinPattern[0 * 4 + state] * patternWeight;
            acrossPatterns[1 * 4 + state] += withinPattern[1 * 4 + state] * patternWeight;
            acrossPatterns[2 * 4 + state] += withinPattern[2 * 4 + state] * patternWeight;
            acrossPatterns[3 * 4 + state] += withinPattern[3 * 4 + state] * patternWeight;

        } else { // Missing character

            for (int category = 0; category < kCategoryCount; category++) {

                const REALTYPE scale = (REALTYPE) categoryRates[category] * edgeLength;

                const REALTYPE weight = categoryWeights[category];
                const int patternIndex = category * kPatternCount + pattern;
                const int v = patternIndex * 4;

                REALTYPE denominator = 0.0;
                for (int k = 0; k < 4; k++) {
                    denominator += preOrderPartial[v + k];
                }
                patternDenominator += denominator * weight;

                for (int k = 0; k < 4; k++) {
                    for (int j = 0; j < 4; j++) {
                        withinPattern[k * 4 + j] += preOrderPartial[v + k] * weight * scale;
                    }
                }
            }

            const REALTYPE patternWeight = gPatternWeights[pattern] / patternDenominator;
            for (int k = 0; k < 16; k++) {
                acrossPatterns[k] += withinPattern[k] * patternWeight;
            }
        }
    }

    for (int k = 0; k < 16; k++) {
        outCrossProducts[k] += acrossPatterns[k]; // TODO transpose back on store
    }
#endif
}